

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

double RoundScalarWithFormat<double,double>(char *format,ImGuiDataType data_type,double v)

{
  char *fmt;
  char **local_80;
  char *p;
  char v_str [64];
  char *fmt_start;
  double v_local;
  char *pcStack_18;
  ImGuiDataType data_type_local;
  char *format_local;
  
  fmt_start = (char *)v;
  v_local._4_4_ = data_type;
  pcStack_18 = format;
  fmt = ImParseFormatFindStart(format);
  if ((*fmt == '%') && (fmt[1] != '%')) {
    ImFormatString((char *)&p,0x40,fmt,fmt_start);
    for (local_80 = &p; *(char *)local_80 == ' '; local_80 = (char **)((long)local_80 + 1)) {
    }
    if ((v_local._4_4_ == 4) || (v_local._4_4_ == 5)) {
      fmt_start = (char *)ImAtof((char *)local_80);
    }
    else {
      ImAtoi<double>((char *)local_80,(double *)&fmt_start);
    }
    format_local = fmt_start;
  }
  else {
    format_local = fmt_start;
  }
  return (double)format_local;
}

Assistant:

static inline TYPE RoundScalarWithFormat(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}